

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_test_result.hpp
# Opt level: O1

void __thiscall
hayai::TestResult::TestResult
          (TestResult *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *runTimes,
          size_t iterations)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  pointer puVar3;
  long lVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t uVar8;
  ulong uVar9;
  long lVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sortedRunTimes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->_runTimes,runTimes);
  this->_iterations = iterations;
  this->_timeTotal = 0;
  this->_timeRunMin = 0xffffffffffffffff;
  this->_timeRunMax = 0;
  this->_timeStdDev = 0.0;
  this->_timeMedian = 0.0;
  this->_timeQuartile1 = 0.0;
  this->_timeQuartile3 = 0.0;
  puVar5 = (this->_runTimes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->_runTimes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar3) {
    uVar8 = this->_timeTotal;
    uVar11 = this->_timeRunMin;
    uVar12 = this->_timeRunMax;
    lVar10 = 0;
    do {
      uVar6 = *(ulong *)((long)puVar5 + lVar10);
      uVar8 = uVar8 + uVar6;
      this->_timeTotal = uVar8;
      if ((lVar10 == 0) || (uVar12 < uVar6)) {
        this->_timeRunMax = uVar6;
        uVar12 = uVar6;
      }
      if ((lVar10 == 0) || (uVar6 < uVar11)) {
        this->_timeRunMin = uVar6;
        uVar11 = uVar6;
      }
      lVar4 = lVar10 + 8;
      lVar10 = lVar10 + 8;
    } while ((pointer)((long)puVar5 + lVar4) != puVar3);
  }
  lVar10 = (long)puVar3 - (long)puVar5 >> 3;
  dVar13 = 0.0;
  if (puVar3 != puVar5) {
    uVar8 = this->_timeTotal;
    auVar14._8_4_ = (int)(uVar8 >> 0x20);
    auVar14._0_8_ = uVar8;
    auVar14._12_4_ = 0x45300000;
    auVar15._8_4_ = (int)((long)puVar3 - (long)puVar5 >> 0x23);
    auVar15._0_8_ = lVar10;
    auVar15._12_4_ = 0x45300000;
    dVar13 = 0.0;
    do {
      dVar24 = (((double)CONCAT44(0x45300000,(int)(*puVar5 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)*puVar5) - 4503599627370496.0)) -
               ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) /
               ((auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
      dVar13 = dVar13 + dVar24 * dVar24;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar3);
  }
  lVar10 = lVar10 + -1;
  auVar23._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar23._0_8_ = lVar10;
  auVar23._12_4_ = 0x45300000;
  dVar13 = dVar13 / ((auVar23._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  this->_timeStdDev = dVar13;
  inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_30,&this->_runTimes);
  puVar3 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    lVar10 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar5,puVar3);
  }
  uVar9 = (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar6 = (long)uVar9 >> 3;
  if (uVar6 < 2) {
    if (uVar9 != 8) goto LAB_0013b810;
    dVar13 = ((double)CONCAT44(0x45300000,
                               (int)(*local_30.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 0x20)) -
             1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,
                               (int)*local_30.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start) - 4503599627370496.0
             );
    this->_timeQuartile1 = dVar13;
  }
  else {
    uVar7 = uVar6 >> 1;
    uVar6 = uVar6 >> 2;
    if ((uVar9 & 8) == 0) {
      uVar1 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7 - 1];
      auVar16._8_4_ = (int)(uVar1 >> 0x20);
      auVar16._0_8_ = uVar1;
      auVar16._12_4_ = 0x45300000;
      uVar2 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      auVar17._8_4_ = (int)(uVar2 >> 0x20);
      auVar17._0_8_ = uVar2;
      auVar17._12_4_ = 0x45300000;
      this->_timeMedian =
           ((auVar17._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
           (auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 0.5;
      uVar1 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      auVar18._8_4_ = (int)(uVar1 >> 0x20);
      auVar18._0_8_ = uVar1;
      auVar18._12_4_ = 0x45300000;
      this->_timeQuartile1 =
           (auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      dVar13 = ((double)CONCAT44(0x45300000,
                                 (int)(local_30.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar7 + uVar6] >>
                                      0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,
                                 (int)local_30.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar7 + uVar6]) -
               4503599627370496.0);
    }
    else {
      uVar1 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      auVar19._8_4_ = (int)(uVar1 >> 0x20);
      auVar19._0_8_ = uVar1;
      auVar19._12_4_ = 0x45300000;
      this->_timeMedian =
           (auVar19._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      puVar5 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + uVar6;
      uVar1 = puVar5[-1];
      auVar20._8_4_ = (int)(uVar1 >> 0x20);
      auVar20._0_8_ = uVar1;
      auVar20._12_4_ = 0x45300000;
      uVar2 = *puVar5;
      auVar21._8_4_ = (int)(uVar2 >> 0x20);
      auVar21._0_8_ = uVar2;
      auVar21._12_4_ = 0x45300000;
      this->_timeQuartile1 =
           ((auVar21._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
           (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 0.5;
      uVar1 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7 + (uVar6 - 1)];
      auVar22._8_4_ = (int)(uVar1 >> 0x20);
      auVar22._0_8_ = uVar1;
      auVar22._12_4_ = 0x45300000;
      dVar13 = (((double)CONCAT44(0x45300000,(int)(puVar5[uVar7] >> 0x20)) - 1.9342813113834067e+25)
                + ((double)CONCAT44(0x43300000,(int)puVar5[uVar7]) - 4503599627370496.0) +
               (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 0.5;
    }
  }
  this->_timeQuartile3 = dVar13;
LAB_0013b810:
  if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TestResult(const std::vector<uint64_t>& runTimes,
                   std::size_t iterations)
            :   _runTimes(runTimes),
                _iterations(iterations),
                _timeTotal(0),
                _timeRunMin(std::numeric_limits<uint64_t>::max()),
                _timeRunMax(std::numeric_limits<uint64_t>::min()),
                _timeStdDev(0.0),
                _timeMedian(0.0),
                _timeQuartile1(0.0),
                _timeQuartile3(0.0)
        {
            // Summarize under the assumption of values being accessed more
            // than once.
            std::vector<uint64_t>::iterator runIt = _runTimes.begin();

            while (runIt != _runTimes.end())
            {
                const uint64_t run = *runIt;

                _timeTotal += run;
                if ((runIt == _runTimes.begin()) || (run > _timeRunMax))
                    _timeRunMax = run;
                if ((runIt == _runTimes.begin()) || (run < _timeRunMin))
                    _timeRunMin = run;

                ++runIt;
            }

            // Calculate standard deviation.
            const double mean = RunTimeAverage();
            double accu = 0.0;

            runIt = _runTimes.begin();

            while (runIt != _runTimes.end())
            {
                const uint64_t run = *runIt;
                const double diff = double(run) - mean;
                accu += (diff * diff);

                ++runIt;
            }

            _timeStdDev = std::sqrt(accu / (_runTimes.size() - 1));

            // Calculate quartiles.
            std::vector<uint64_t> sortedRunTimes(_runTimes);
            std::sort(sortedRunTimes.begin(), sortedRunTimes.end());

            const std::size_t sortedSize = sortedRunTimes.size();
            const std::size_t sortedSizeHalf = sortedSize / 2;

            if (sortedSize >= 2)
            {
                const std::size_t quartile = sortedSizeHalf / 2;

                if ((sortedSize % 2) == 0)
                {
                    _timeMedian =
                        (double(sortedRunTimes[sortedSizeHalf - 1]) +
                         double(sortedRunTimes[sortedSizeHalf])) / 2;

                    _timeQuartile1 =
                        double(sortedRunTimes[quartile]);
                    _timeQuartile3 =
                        double(sortedRunTimes[sortedSizeHalf + quartile]);
                }
                else
                {
                    _timeMedian = double(sortedRunTimes[sortedSizeHalf]);

                    _timeQuartile1 =
                        (double(sortedRunTimes[quartile - 1]) +
                         double(sortedRunTimes[quartile])) / 2;
                    _timeQuartile3 = (
                        double(
                            sortedRunTimes[sortedSizeHalf + (quartile - 1)]
                        ) +
                        double(
                            sortedRunTimes[sortedSizeHalf + quartile]
                        )
                    ) / 2;
                }
            }
            else if (sortedSize > 0)
            {
                _timeQuartile1 = double(sortedRunTimes[0]);
                _timeQuartile3 = _timeQuartile1;
            }
        }